

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathNsLookup(xmlXPathContextPtr ctxt,xmlChar *prefix)

{
  int iVar1;
  int local_24;
  int i;
  xmlChar *prefix_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if (prefix == (xmlChar *)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else {
    iVar1 = xmlStrEqual(prefix,(xmlChar *)"xml");
    if (iVar1 == 0) {
      if (ctxt->namespaces != (xmlNsPtr *)0x0) {
        for (local_24 = 0; local_24 < ctxt->nsNr; local_24 = local_24 + 1) {
          if ((ctxt->namespaces[local_24] != (xmlNsPtr)0x0) &&
             (iVar1 = xmlStrEqual(ctxt->namespaces[local_24]->prefix,prefix), iVar1 != 0)) {
            return ctxt->namespaces[local_24]->href;
          }
        }
      }
      ctxt_local = (xmlXPathContextPtr)xmlHashLookup(ctxt->nsHash,prefix);
    }
    else {
      ctxt_local = (xmlXPathContextPtr)anon_var_dwarf_f91a;
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

const xmlChar *
xmlXPathNsLookup(xmlXPathContextPtr ctxt, const xmlChar *prefix) {
    if (ctxt == NULL)
	return(NULL);
    if (prefix == NULL)
	return(NULL);

    if (xmlStrEqual(prefix, (const xmlChar *) "xml"))
	return(XML_XML_NAMESPACE);

    if (ctxt->namespaces != NULL) {
	int i;

	for (i = 0;i < ctxt->nsNr;i++) {
	    if ((ctxt->namespaces[i] != NULL) &&
		(xmlStrEqual(ctxt->namespaces[i]->prefix, prefix)))
		return(ctxt->namespaces[i]->href);
	}
    }

    return((const xmlChar *) xmlHashLookup(ctxt->nsHash, prefix));
}